

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_session.c
# Opt level: O0

char * get_Date_line(void)

{
  char *__src;
  char *time;
  char *d;
  char date [64];
  
  memset(&d,0,0x40);
  d._0_1_ = 0x44;
  d._1_1_ = 0x61;
  d._2_1_ = 0x74;
  d._3_1_ = 0x65;
  d._4_1_ = 0x3a;
  __src = get_current_time();
  strcat((char *)&d,__src);
  strcat((char *)&d," GMT\r\n");
  return (char *)&d;
}

Assistant:

char *get_Date_line(){
    char date[64] = "Date:", *d;
    char *time;
    strcat(date, get_current_time());
    strcat(date, " GMT\r\n");
    d = date;
    return d;
}